

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveObjectsWriter.cpp
# Opt level: O0

void __thiscall
PrimitiveObjectsWriter::WriteName
          (PrimitiveObjectsWriter *this,string *inName,ETokenSeparator inSeparate)

{
  byte bVar1;
  IByteWriter *pIVar2;
  bool bVar3;
  byte *pbVar4;
  long lVar5;
  size_t sVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_38;
  Byte aValue;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  const_iterator it;
  Byte buffer [5];
  ETokenSeparator inSeparate_local;
  string *inName_local;
  PrimitiveObjectsWriter *this_local;
  
  if (this->mStreamForWriting != (IByteWriter *)0x0) {
    (*this->mStreamForWriting->_vptr_IByteWriter[2])(this->mStreamForWriting,"/",1);
    local_30._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      _Stack_38._M_current = (char *)std::__cxx11::string::end();
      bVar3 = __gnu_cxx::operator!=(&local_30,&stack0xffffffffffffffc8);
      if (!bVar3) break;
      pbVar4 = (byte *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_30);
      bVar1 = *pbVar4;
      if (((bVar1 < 0x21) || (0x7e < bVar1)) ||
         (lVar5 = std::__cxx11::string::find('`',(ulong)(uint)(int)(char)bVar1), lVar5 != -1)) {
        sprintf((char *)((long)&it._M_current + 7),"#%02x",(ulong)bVar1);
        pIVar2 = this->mStreamForWriting;
        sVar6 = strlen((char *)((long)&it._M_current + 7));
        (*pIVar2->_vptr_IByteWriter[2])(pIVar2,(undefined1 *)((long)&it._M_current + 7),sVar6);
      }
      else {
        it._M_current._7_1_ = bVar1;
        (*this->mStreamForWriting->_vptr_IByteWriter[2])
                  (this->mStreamForWriting,(undefined1 *)((long)&it._M_current + 7),1);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_30);
    }
    WriteTokenSeparator(this,inSeparate);
  }
  return;
}

Assistant:

void PrimitiveObjectsWriter::WriteName(const std::string& inName,ETokenSeparator inSeparate)
{
/*
from the pdf reference:
This syntax is required to represent any of the delimiter or white-space characters or the number sign character itself; 
it is recommended but not required for characters whose codes are outside the range 33 (!) to 126 (~).
*/
	if(!mStreamForWriting)
		return;

	mStreamForWriting->Write(scSlash,1);

	IOBasicTypes::Byte buffer[5];
	std::string::const_iterator it = inName.begin();
	for(;it != inName.end();++it)
	{
		Byte aValue = *it;

		if(aValue < 33 || aValue > 126 || scSpecialChars.find(aValue) != scSpecialChars.npos)
		{
			SAFE_SPRINTF_1((char*)buffer,5,"#%02x",aValue); 
			mStreamForWriting->Write(buffer,strlen((char*)buffer));		
		}
		else
		{
			buffer[0] = aValue;
			mStreamForWriting->Write(buffer,1);
		}
	}

	WriteTokenSeparator(inSeparate);
}